

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturecache.cpp
# Opt level: O0

void __thiscall QOpenGLTextureCache::~QOpenGLTextureCache(QOpenGLTextureCache *this)

{
  QCache<unsigned_long_long,_QOpenGLCachedTexture> *in_RDI;
  
  (in_RDI->chain).prev = (Chain *)&PTR__QOpenGLTextureCache_002141b8;
  QCache<unsigned_long_long,_QOpenGLCachedTexture>::~QCache(in_RDI);
  QMutex::~QMutex((QMutex *)in_RDI);
  QOpenGLSharedResource::~QOpenGLSharedResource((QOpenGLSharedResource *)in_RDI);
  return;
}

Assistant:

QOpenGLTextureCache::~QOpenGLTextureCache()
{
}